

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_ecmult.c
# Opt level: O0

void bench_ecmult_teardown_helper
               (bench_data *data,size_t *seckey_offset,size_t *scalar_offset,
               size_t *scalar_gen_offset,int iters)

{
  secp256k1_ecmult_gen_context *in_RCX;
  long in_RSI;
  int in_R8D;
  secp256k1_scalar s;
  secp256k1_scalar sum_scalars;
  secp256k1_gej tmp;
  secp256k1_gej sum_output;
  int i;
  undefined8 in_stack_fffffffffffffe98;
  uint v;
  secp256k1_scalar *in_stack_fffffffffffffea0;
  secp256k1_scalar *in_stack_fffffffffffffec0;
  secp256k1_scalar *in_stack_fffffffffffffec8;
  secp256k1_scalar *in_stack_fffffffffffffed0;
  secp256k1_scalar *in_stack_fffffffffffffed8;
  secp256k1_scalar *in_stack_fffffffffffffee0;
  secp256k1_gej *in_stack_ffffffffffffff18;
  secp256k1_gej *in_stack_ffffffffffffff20;
  secp256k1_scalar *in_stack_ffffffffffffffd0;
  int iVar1;
  
  v = (uint)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  secp256k1_gej_set_infinity((secp256k1_gej *)0x12177c);
  secp256k1_scalar_set_int(in_stack_fffffffffffffea0,v);
  for (iVar1 = 0; iVar1 < in_R8D; iVar1 = iVar1 + 1) {
    secp256k1_gej_add_var
              ((secp256k1_gej *)tmp.x.n[4],(secp256k1_gej *)tmp.x.n[3],(secp256k1_gej *)tmp.x.n[2],
               (secp256k1_fe *)tmp.x.n[1]);
    if (in_RCX != (secp256k1_ecmult_gen_context *)0x0) {
      secp256k1_scalar_add
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    }
    if (in_RSI != 0) {
      secp256k1_scalar_mul
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      secp256k1_scalar_add
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    }
  }
  secp256k1_ecmult_gen(in_RCX,(secp256k1_gej *)CONCAT44(in_R8D,iVar1),in_stack_ffffffffffffffd0);
  iVar1 = secp256k1_gej_eq_var(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/bench_ecmult.c"
            ,0x58,"test condition failed: secp256k1_gej_eq_var(&tmp, &sum_output)");
    abort();
  }
  return;
}

Assistant:

static void bench_ecmult_teardown_helper(bench_data* data, size_t* seckey_offset, size_t* scalar_offset, size_t* scalar_gen_offset, int iters) {
    int i;
    secp256k1_gej sum_output, tmp;
    secp256k1_scalar sum_scalars;

    secp256k1_gej_set_infinity(&sum_output);
    secp256k1_scalar_set_int(&sum_scalars, 0);
    for (i = 0; i < iters; ++i) {
        secp256k1_gej_add_var(&sum_output, &sum_output, &data->output[i], NULL);
        if (scalar_gen_offset != NULL) {
            secp256k1_scalar_add(&sum_scalars, &sum_scalars, &data->scalars[(*scalar_gen_offset+i) % POINTS]);
        }
        if (seckey_offset != NULL) {
            secp256k1_scalar s = data->seckeys[(*seckey_offset+i) % POINTS];
            secp256k1_scalar_mul(&s, &s, &data->scalars[(*scalar_offset+i) % POINTS]);
            secp256k1_scalar_add(&sum_scalars, &sum_scalars, &s);
        }
    }
    secp256k1_ecmult_gen(&data->ctx->ecmult_gen_ctx, &tmp, &sum_scalars);
    CHECK(secp256k1_gej_eq_var(&tmp, &sum_output));
}